

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

ScatterOut * __thiscall
cert::Metal::scatter
          (ScatterOut *__return_storage_ptr__,Metal *this,Vec3 point,Vec3 normal,UV uv,Ray *r_in,
          PRNG *random)

{
  float fVar1;
  Vec3 VVar2;
  Vec3 local_a0;
  Vec3 local_90;
  Vec3 local_80;
  undefined1 local_74 [8];
  Vec3 reflected;
  PRNG *random_local;
  Ray *r_in_local;
  Metal *this_local;
  UV uv_local;
  undefined1 local_38 [8];
  Vec3 normal_local;
  undefined1 local_18 [8];
  Vec3 point_local;
  
  normal_local.x = normal.z;
  local_38 = normal._0_8_;
  point_local.x = point.z;
  register0x00001200 = point._0_8_;
  reflected._4_8_ = random;
  local_18 = (undefined1  [8])register0x00001200;
  VVar2 = normalize(&r_in->direction);
  local_90.z = VVar2.z;
  local_80.z = local_90.z;
  local_90._0_8_ = VVar2._0_8_;
  local_80.x = local_90.x;
  local_80.y = local_90.y;
  VVar2 = reflect(&local_80,(Vec3 *)local_38);
  local_a0._0_8_ = VVar2._0_8_;
  local_74._0_4_ = local_a0.x;
  local_74._4_4_ = local_a0.y;
  local_a0.z = VVar2.z;
  reflected.x = local_a0.z;
  fVar1 = dot((Vec3 *)local_74,(Vec3 *)local_38);
  __return_storage_ptr__->is_scattered = 0.0 < fVar1;
  fVar1 = (this->super_Material).albedo.y;
  (__return_storage_ptr__->attenuation).x = (this->super_Material).albedo.x;
  (__return_storage_ptr__->attenuation).y = fVar1;
  (__return_storage_ptr__->attenuation).z = (this->super_Material).albedo.z;
  Ray::Ray(&__return_storage_ptr__->scattered,(Vec3 *)local_18,(Vec3 *)local_74);
  __return_storage_ptr__->index = -1.0;
  Ray::Ray(&__return_storage_ptr__->refracted,(Vec3 *)&VEC3_ZERO,(Vec3 *)VEC3_RIGHT);
  return __return_storage_ptr__;
}

Assistant:

constexpr virtual ScatterOut scatter (Vec3 point, Vec3 normal, UV uv, const Ray& r_in, PRNG& random) const
	{
		Vec3 reflected = reflect (normalize (r_in.direction), normal);
		return { .is_scattered = dot (reflected, normal) > 0.0,
			.attenuation = albedo,
			.scattered = Ray (point, reflected) };
	}